

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O0

char * parse_offset(int *secs,char *p,size_t *len)

{
  ushort **ppuVar1;
  ulong *in_RDX;
  char *in_RSI;
  int *in_RDI;
  int ss;
  int mm;
  int hh;
  int sign;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *local_18;
  char *local_8;
  
  iVar5 = 1;
  iVar4 = 0;
  iVar3 = 0;
  iVar2 = 0;
  if (((*in_RDX < 2) || (*in_RSI != '+')) ||
     (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)in_RSI[1]] & 0x800) == 0)) {
    local_18 = in_RSI;
    if (((1 < *in_RDX) && (*in_RSI == '-')) &&
       (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)in_RSI[1]] & 0x800) != 0)) {
      iVar5 = -1;
      local_18 = in_RSI + 1;
      *in_RDX = *in_RDX - 1;
    }
  }
  else {
    local_18 = in_RSI + 1;
    *in_RDX = *in_RDX - 1;
  }
  if ((*in_RDX == 0) || (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_18] & 0x800) == 0)) {
    local_8 = local_18;
  }
  else {
    local_18 = parse_digits((int *)in_RDX,(char *)CONCAT44(iVar5,iVar4),
                            (size_t *)CONCAT44(iVar3,iVar2));
    if ((2 < *in_RDX) &&
       (((*local_18 == ':' &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)local_18[1]] & 0x800) != 0)) &&
        (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)local_18[2]] & 0x800) != 0)))) {
      *in_RDX = *in_RDX - 1;
      local_18 = parse_digits((int *)in_RDX,(char *)CONCAT44(iVar5,iVar4),
                              (size_t *)CONCAT44(iVar3,iVar2));
      if (((2 < *in_RDX) && (*local_18 == ':')) &&
         ((ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)local_18[1]] & 0x800) != 0 &&
          (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)local_18[2]] & 0x800) != 0)))) {
        *in_RDX = *in_RDX - 1;
        local_18 = parse_digits((int *)in_RDX,(char *)CONCAT44(iVar5,iVar4),
                                (size_t *)CONCAT44(iVar3,iVar2));
      }
    }
    *in_RDI = iVar5 * (iVar4 * 0xe10 + iVar3 * 0x3c + iVar2);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

static const char *parse_offset(int *secs, const char *p, size_t *len)
{
    int sign = 1, hh = 0, mm = 0, ss = 0;
    
    /* check for a sign (which must be followed by a digit) */
    if (*len >= 2 && *p == '+' && isdigit(p[1]))
        ++p, --*len;
    else if (*len >= 2 && *p == '-' && isdigit(p[1]))
        sign = -1, ++p, --*len;

    /* if we don't have a digit, it's not a number */
    if (*len == 0 || !isdigit(*p))
        return p;

    /* parse the hours */
    p = parse_digits(&hh, p, len);

    /* check for minutes */
    if (*len >= 3 && *p == ':' && isdigit(p[1]) && isdigit(p[2]))
    {
        /* parse the minutes */
        ++p, --*len;
        p = parse_digits(&mm, p, len);

        /* check for seconds */
        if (*len >= 3 && *p == ':' && isdigit(p[1]) && isdigit(p[2]))
        {
            ++p, --*len;
            p = parse_digits(&ss, p, len);
        }
    }

    /* compute the full time in seconds, and apply the sign */
    *secs = sign*(hh*60*60 + mm*60 + ss);

    /* return the updated pointer */
    return p;
}